

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.h
# Opt level: O2

void __thiscall
wasm::SmallVector<wasm::Literal,_1UL>::resize(SmallVector<wasm::Literal,_1UL> *this,size_t newSize)

{
  this->usedFixed = (ulong)(newSize != 0);
  if (1 < newSize) {
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::resize(&this->flexible,newSize - 1);
    return;
  }
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::clear(&this->flexible);
  return;
}

Assistant:

void resize(size_t newSize) {
    usedFixed = std::min(N, newSize);
    if (newSize > N) {
      flexible.resize(newSize - N);
    } else {
      flexible.clear();
    }
  }